

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteTargetLinkLine
          (cmGhsMultiTargetGenerator *this,ostream *fout,string *config)

{
  cmLocalGenerator *this_00;
  cmGlobalGenerator *pcVar1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  pointer *__ptr;
  pointer pbVar5;
  string *l;
  cmLinkLineComputer *local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lpath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lopts;
  string linkPath;
  string linkFlags;
  string linkLibraries;
  string cbd;
  string rl;
  string frameworkPath;
  string flags;
  
  if (this->TagType != INTERGRITY_APPLICATION) {
    linkLibraries._M_dataplus._M_p = (pointer)&linkLibraries.field_2;
    linkLibraries._M_string_length = 0;
    linkLibraries.field_2._M_local_buf[0] = '\0';
    flags._M_dataplus._M_p = (pointer)&flags.field_2;
    flags._M_string_length = 0;
    linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
    linkFlags._M_string_length = 0;
    flags.field_2._M_local_buf[0] = '\0';
    linkFlags.field_2._M_local_buf[0] = '\0';
    frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
    frameworkPath._M_string_length = 0;
    linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
    linkPath._M_string_length = 0;
    frameworkPath.field_2._M_local_buf[0] = '\0';
    linkPath.field_2._M_local_buf[0] = '\0';
    this_00 = &this->LocalGenerator->super_cmLocalGenerator;
    pcVar1 = this_00->GlobalGenerator;
    cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&rl,this_00);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&cbd,(cmStateSnapshot *)&rl);
    (*pcVar1->_vptr_cmGlobalGenerator[0x12])(&local_168,pcVar1,this_00,&cbd);
    cmLocalGenerator::GetTargetFlags
              (&this->LocalGenerator->super_cmLocalGenerator,local_168,config,&linkLibraries,&flags,
               &linkFlags,&frameworkPath,&linkPath,this->GeneratorTarget);
    cmSystemTools::ParseArguments(&lopts,&linkFlags);
    for (pbVar5 = lopts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 != lopts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
      poVar3 = std::operator<<(fout,"    ");
      poVar3 = std::operator<<(poVar3,(string *)pbVar5);
      std::operator<<(poVar3,'\n');
    }
    cmSystemTools::ParseArguments(&lpath,&linkPath);
    for (pbVar5 = lpath.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 != lpath.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
      poVar3 = std::operator<<(fout,"    -L\"");
      poVar3 = std::operator<<(poVar3,(string *)pbVar5);
      std::operator<<(poVar3,"\"\n");
    }
    psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       (&this->LocalGenerator->super_cmLocalGenerator);
    std::__cxx11::string::string((string *)&cbd,(string *)psVar4);
    cmSystemTools::ParseArguments(&llibs,&linkLibraries);
    for (pbVar5 = llibs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 != llibs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
      iVar2 = std::__cxx11::string::compare((ulong)pbVar5,0,(char *)0x2);
      if (iVar2 == 0) {
        poVar3 = std::operator<<(fout,"    \"");
        poVar3 = std::operator<<(poVar3,(string *)pbVar5);
        std::operator<<(poVar3,"\"\n");
      }
      else {
        cmsys::SystemTools::CollapseFullPath(&rl,pbVar5,&cbd);
        poVar3 = std::operator<<(fout,"    -l\"");
        poVar3 = std::operator<<(poVar3,(string *)&rl);
        std::operator<<(poVar3,"\"\n");
        std::__cxx11::string::~string((string *)&rl);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&llibs);
    std::__cxx11::string::~string((string *)&cbd);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&lpath);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&lopts);
    if (local_168 != (cmLinkLineComputer *)0x0) {
      (*local_168->_vptr_cmLinkLineComputer[1])();
    }
    std::__cxx11::string::~string((string *)&linkPath);
    std::__cxx11::string::~string((string *)&frameworkPath);
    std::__cxx11::string::~string((string *)&linkFlags);
    std::__cxx11::string::~string((string *)&flags);
    std::__cxx11::string::~string((string *)&linkLibraries);
  }
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteTargetLinkLine(std::ostream& fout,
                                                    std::string const& config)
{
  if (this->TagType == GhsMultiGpj::INTERGRITY_APPLICATION) {
    return;
  }

  std::string linkLibraries;
  std::string flags;
  std::string linkFlags;
  std::string frameworkPath;
  std::string linkPath;

  std::unique_ptr<cmLinkLineComputer> linkLineComputer =
    this->GetGlobalGenerator()->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory());

  this->LocalGenerator->GetTargetFlags(
    linkLineComputer.get(), config, linkLibraries, flags, linkFlags,
    frameworkPath, linkPath, this->GeneratorTarget);

  // write out link options
  std::vector<std::string> lopts = cmSystemTools::ParseArguments(linkFlags);
  for (const std::string& l : lopts) {
    fout << "    " << l << '\n';
  }

  // write out link search paths
  // must be quoted for paths that contain spaces
  std::vector<std::string> lpath = cmSystemTools::ParseArguments(linkPath);
  for (const std::string& l : lpath) {
    fout << "    -L\"" << l << "\"\n";
  }

  // write out link libs
  // must be quoted for filepaths that contains spaces
  std::string cbd = this->LocalGenerator->GetCurrentBinaryDirectory();

  std::vector<std::string> llibs =
    cmSystemTools::ParseArguments(linkLibraries);
  for (const std::string& l : llibs) {
    if (l.compare(0, 2, "-l") == 0) {
      fout << "    \"" << l << "\"\n";
    } else {
      std::string rl = cmSystemTools::CollapseFullPath(l, cbd);
      fout << "    -l\"" << rl << "\"\n";
    }
  }
}